

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *psVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  auto_ptr<cmCryptoHash> aVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  long lVar9;
  cmCryptoHash *this_00;
  long lVar10;
  ostream *poVar11;
  CURL_conflict *data;
  curl_slist *list;
  char *pcVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  ulong uVar16;
  pointer pbVar17;
  value_type *s;
  cmCryptoHash *x_1;
  auto_ptr<cmCryptoHash> hash;
  string err_2;
  cURLProgressHelper helper;
  string actualHash_1;
  string expectedHash;
  string file;
  string dir;
  string statusVar;
  cmFileCommandVectorOfChar chunkDebug;
  string status;
  string hashMatchMSG;
  ofstream fout;
  string logVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string userpwd;
  string url;
  bool local_5d1;
  auto_ptr<cmCryptoHash> local_5d0;
  long local_5c8;
  undefined1 local_5c0 [8];
  char *local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0 [6];
  ios_base local_550 [264];
  undefined1 local_448 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  vector<char,_std::allocator<char>_> local_378;
  char *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 *local_338;
  char *local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  undefined1 local_318 [8];
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  byte abStack_2f8 [80];
  ios_base local_2a8 [136];
  ios_base local_220 [264];
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  long *local_b8 [2];
  long local_a8 [2];
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17) < 0x41) {
    local_318 = (undefined1  [8])&local_308;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_318,"DOWNLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
    if (local_318 != (undefined1  [8])&local_308) {
      operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
    }
    return false;
  }
  local_b8[0] = local_a8;
  pcVar2 = pbVar17[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar2,pcVar2 + pbVar17[1]._M_string_length);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  pcVar2 = pbVar17[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,pcVar2,pcVar2 + pbVar17[2]._M_string_length);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommand).Makefile;
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"CMAKE_TLS_VERIFY","");
  local_5d1 = cmMakefile::IsOn(pcVar3,(string *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"CMAKE_TLS_CAINFO","");
  local_360 = cmMakefile::GetDefinition(pcVar3,(string *)local_318);
  s = pbVar17 + 3;
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  lVar9 = 0;
  local_3f8._M_string_length = 0;
  uVar16 = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  local_338 = &local_328;
  local_330 = (char *)0x0;
  local_328 = 0;
  local_5d0.x_ = (cmCryptoHash *)0x0;
  local_d8 = &local_c8;
  local_d0 = 0;
  local_c8 = 0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (s == (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) {
    local_5c8 = 0;
  }
  else {
    local_5c8 = 0;
    lVar9 = 0;
    uVar16 = 0;
    do {
      iVar7 = std::__cxx11::string::compare((char *)s);
      if (iVar7 == 0) {
        s = s + 1;
        if (s == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
          local_318 = (undefined1  [8])&local_308;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_318,"DOWNLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
          goto LAB_002f2dd4;
        }
        local_5c8 = atol((s->_M_dataplus)._M_p);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)s);
        if (iVar7 == 0) {
          s = s + 1;
          if (s == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
            local_318 = (undefined1  [8])&local_308;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_318,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
            goto LAB_002f2dd4;
          }
          lVar9 = atol((s->_M_dataplus)._M_p);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)s);
          if (iVar7 == 0) {
            s = s + 1;
            if (s == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
              local_318 = (undefined1  [8])&local_308;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_318,"DOWNLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
              goto LAB_002f2dd4;
            }
            std::__cxx11::string::_M_assign((string *)&local_118);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)s);
            if (iVar7 == 0) {
              s = s + 1;
              if (s == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
                local_318 = (undefined1  [8])&local_308;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_318,"DOWNLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                goto LAB_002f2dd4;
              }
              std::__cxx11::string::_M_assign((string *)&local_398);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)s);
              if (iVar7 == 0) {
                s = s + 1;
                if (s == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
                  local_318 = (undefined1  [8])&local_308;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_318,"TLS_VERIFY missing bool value.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                  goto LAB_002f2dd4;
                }
                local_5d1 = cmSystemTools::IsOn((s->_M_dataplus)._M_p);
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)s);
                if (iVar7 == 0) {
                  s = s + 1;
                  if (s == (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish) {
                    local_318 = (undefined1  [8])&local_308;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_318,"TLS_CAFILE missing file value.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                    goto LAB_002f2dd4;
                  }
                  local_360 = (s->_M_dataplus)._M_p;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)s);
                  if (iVar7 == 0) {
                    s = s + 1;
                    if (s == (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish) {
                      local_318 = (undefined1  [8])&local_308;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_318,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                                 "");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                      goto LAB_002f2dd4;
                    }
                    this_00 = (cmCryptoHash *)operator_new(0x10);
                    cmCryptoHash::cmCryptoHash(this_00,AlgoMD5);
                    local_318 = (undefined1  [8])0x0;
                    ::cm::auto_ptr<cmCryptoHash>::reset(&local_5d0,this_00);
                    ::cm::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)local_318);
                    std::__cxx11::string::_M_replace((ulong)&local_338,0,local_330,0x56ce65);
                    cmsys::SystemTools::LowerCase((string *)local_318,s);
                    std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_318);
LAB_002f2225:
                    if (local_318 != (undefined1  [8])&local_308) {
                      operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)s);
                    if (iVar7 == 0) {
                      uVar16 = CONCAT71((int7)(uVar16 >> 8),1);
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)s);
                      if (iVar7 == 0) {
                        psVar1 = s + 1;
                        if (psVar1 == (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish) {
                          local_318 = (undefined1  [8])&local_308;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_318,
                                     "DOWNLOAD missing ALGO=value for EXPECTED_HASH.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
LAB_002f2dd4:
                          if (local_318 != (undefined1  [8])&local_308) {
                            operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
                          }
                        }
                        else {
                          local_98 = uVar16;
                          lVar10 = std::__cxx11::string::find((char *)psVar1,0x587310,0);
                          if (lVar10 == -1) {
                            local_318 = (undefined1  [8])&local_308;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_318,
                                       "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ","");
                            std::__cxx11::string::_M_append(local_318,(ulong)s[1]._M_dataplus._M_p);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                            goto LAB_002f2dd4;
                          }
                          std::__cxx11::string::substr((ulong)local_318,(ulong)psVar1);
                          std::__cxx11::string::substr((ulong)local_448,(ulong)psVar1);
                          cmsys::SystemTools::LowerCase((string *)local_5c0,(string *)local_448);
                          std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_5c0);
                          if (local_5c0 != (undefined1  [8])local_5b0) {
                            operator_delete((void *)local_5c0,
                                            CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                                     local_5b0[0]._M_local_buf[0]) + 1);
                          }
                          if ((cmCryptoHash *)local_448._0_8_ != (cmCryptoHash *)(local_448 + 0x10))
                          {
                            operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
                          }
                          cmCryptoHash::New((cmCryptoHash *)local_448,(char *)local_318);
                          uVar5 = local_448._0_8_;
                          local_448._0_8_ = (cmCryptoHash *)0x0;
                          local_5c0 = (undefined1  [8])0x0;
                          ::cm::auto_ptr<cmCryptoHash>::reset(&local_5d0,(cmCryptoHash *)uVar5);
                          ::cm::auto_ptr<cmCryptoHash>::~auto_ptr
                                    ((auto_ptr<cmCryptoHash> *)local_5c0);
                          ::cm::auto_ptr<cmCryptoHash>::~auto_ptr
                                    ((auto_ptr<cmCryptoHash> *)local_448);
                          aVar4.x_ = local_5d0.x_;
                          if (local_5d0.x_ == (cmCryptoHash *)0x0) {
                            local_5c0 = (undefined1  [8])local_5b0;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_5c0,
                                       "DOWNLOAD EXPECTED_HASH given unknown ALGO: ","");
                            std::__cxx11::string::_M_append((char *)local_5c0,(ulong)local_318);
                            cmCommand::SetError(&this->super_cmCommand,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_5c0);
                          }
                          else {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_5c0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_318," hash");
                            std::__cxx11::string::operator=
                                      ((string *)&local_338,(string *)local_5c0);
                          }
                          if (local_5c0 != (undefined1  [8])local_5b0) {
                            operator_delete((void *)local_5c0,
                                            CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                                     local_5b0[0]._M_local_buf[0]) + 1);
                          }
                          if (local_318 != (undefined1  [8])&local_308) {
                            operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
                          }
                          uVar16 = local_98;
                          s = psVar1;
                          if (aVar4.x_ != (cmCryptoHash *)0x0) goto LAB_002f20fb;
                        }
                        bVar6 = false;
                        goto LAB_002f2dfb;
                      }
                      iVar7 = std::__cxx11::string::compare((char *)s);
                      if (iVar7 == 0) {
                        if (s + 1 == (args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish) {
                          local_318 = (undefined1  [8])&local_308;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_318,"DOWNLOAD missing string for USERPWD.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                          goto LAB_002f2dd4;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_d8);
                        s = s + 1;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare((char *)s);
                        if (iVar7 != 0) {
                          local_318 = (undefined1  [8])&local_308;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_318,"Unexpected argument: ","");
                          std::__cxx11::string::_M_append
                                    ((char *)local_318,(ulong)(s->_M_dataplus)._M_p);
                          cmMakefile::IssueMessage
                                    ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                     (string *)local_318);
                          goto LAB_002f2225;
                        }
                        s = s + 1;
                        if (s == (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish) {
                          local_318 = (undefined1  [8])&local_308;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_318,"DOWNLOAD missing string for HTTPHEADER.",
                                     "");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                          goto LAB_002f2dd4;
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(&local_f8,s);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_002f20fb:
      s = s + 1;
    } while (s != (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar6 = cmsys::SystemTools::FileExists(local_3d8._M_dataplus._M_p);
  if ((bVar6) && (local_5d0.x_ != (cmCryptoHash *)0x0)) {
    local_5b8 = (char *)0x0;
    local_5b0[0]._M_local_buf[0] = '\0';
    local_5c0 = (undefined1  [8])local_5b0;
    cmCryptoHash::HashFile((string *)local_448,local_5d0.x_,&local_3d8);
    uVar5 = local_448._0_8_;
    if ((local_448._8_8_ == local_3f8._M_string_length) &&
       (((cmFileCommand *)local_448._8_8_ == (cmFileCommand *)0x0 ||
        (iVar7 = bcmp((void *)local_448._0_8_,local_3f8._M_dataplus._M_p,local_448._8_8_),
        iVar7 == 0)))) {
      std::__cxx11::string::_M_replace((ulong)local_5c0,0,local_5b8,0x56cf94);
      std::__cxx11::string::_M_append(local_5c0,(ulong)local_338);
      std::__cxx11::string::append(local_5c0);
      if (local_398._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
        poVar11 = (ostream *)std::ostream::operator<<(local_318,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(char *)local_5c0,(long)local_5b8);
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(pcVar3,&local_398,local_3b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
        std::ios_base::~ios_base(local_2a8);
      }
      if ((cmCryptoHash *)local_448._0_8_ != (cmCryptoHash *)(local_448 + 0x10)) {
        operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
      }
      if (local_5c0 != (undefined1  [8])local_5b0) {
        operator_delete((void *)local_5c0,
                        CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                 local_5b0[0]._M_local_buf[0]) + 1);
      }
      bVar6 = true;
      goto LAB_002f2dfb;
    }
    if ((cmCryptoHash *)uVar5 != (cmCryptoHash *)(local_448 + 0x10)) {
      operator_delete((void *)uVar5,local_448._16_8_ + 1);
    }
    if (local_5c0 != (undefined1  [8])local_5b0) {
      operator_delete((void *)local_5c0,
                      CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,local_5b0[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  cmsys::SystemTools::GetFilenamePath(&local_3b8,&local_3d8);
  bVar6 = cmsys::SystemTools::FileExists(local_3b8._M_dataplus._M_p);
  if ((bVar6) || (bVar6 = cmsys::SystemTools::MakeDirectory(local_3b8._M_dataplus._M_p), bVar6)) {
    std::ofstream::ofstream(local_318,local_3d8._M_dataplus._M_p,_S_bin);
    if ((abStack_2f8[*(long *)((long)local_318 + -0x18)] & 5) == 0) {
      curl_global_init(3);
      data = curl_easy_init();
      if (data == (CURL_conflict *)0x0) {
        local_5c0 = (undefined1  [8])local_5b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5c0,"DOWNLOAD error initializing curl.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
        goto LAB_002f278e;
      }
      CVar8 = curl_easy_setopt(data,CURLOPT_URL,local_b8[0]);
      if (CVar8 == CURLE_OK) {
        CVar8 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
        if (CVar8 != CURLE_OK) {
          local_5c0 = (undefined1  [8])local_5b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,"DOWNLOAD cannot set http failure option: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_5c0);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
          goto LAB_002f2cdf;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_USERAGENT,"curl/7.54.1");
        if (CVar8 != CURLE_OK) {
          local_5c0 = (undefined1  [8])local_5b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,"DOWNLOAD cannot set user agent option: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_5c0);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
          goto LAB_002f2cdf;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_4f4c3f::cmWriteToFileCallback);
        if (CVar8 != CURLE_OK) {
          local_5c0 = (undefined1  [8])local_5b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,"DOWNLOAD cannot set write function: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_5c0);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
          goto LAB_002f2cdf;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_4f4c3f::cmFileCommandCurlDebugCallback);
        if (CVar8 != CURLE_OK) {
          local_5c0 = (undefined1  [8])local_5b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,"DOWNLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_5c0);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
          goto LAB_002f2cdf;
        }
        if (local_5d1 == false) {
          CVar8 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar8 == CURLE_OK) goto LAB_002f2ff7;
          local_5c0 = (undefined1  [8])local_5b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,"Unable to set TLS/SSL Verify off: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_5c0);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
          goto LAB_002f2cdf;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar8 != CURLE_OK) {
          local_5c0 = (undefined1  [8])local_5b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,"Unable to set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_5c0);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
          goto LAB_002f2cdf;
        }
LAB_002f2ff7:
        cmCurlSetCAInfo_abi_cxx11_(&local_70,data,local_360);
        if (local_70._M_string_length == 0) {
          local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (char *)0x0;
          local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          CVar8 = curl_easy_setopt(data,CURLOPT_WRITEDATA,local_318);
          if (CVar8 == CURLE_OK) {
            CVar8 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_378);
            if (CVar8 != CURLE_OK) {
              local_5c0 = (undefined1  [8])local_5b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5c0,"DOWNLOAD cannot set debug data: ","");
              curl_easy_strerror(CVar8);
              std::__cxx11::string::append(local_5c0);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
              goto LAB_002f3175;
            }
            CVar8 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
            if (CVar8 != CURLE_OK) {
              local_5c0 = (undefined1  [8])local_5b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5c0,"DOWNLOAD cannot set follow-redirect option: ","");
              curl_easy_strerror(CVar8);
              std::__cxx11::string::append(local_5c0);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
              goto LAB_002f3175;
            }
            if ((local_118._M_string_length != 0) &&
               (CVar8 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar8 != CURLE_OK)) {
              local_5c0 = (undefined1  [8])local_5b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5c0,"DOWNLOAD cannot set verbose: ","");
              curl_easy_strerror(CVar8);
              std::__cxx11::string::append(local_5c0);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
              goto LAB_002f3175;
            }
            if ((0 < local_5c8) &&
               (CVar8 = curl_easy_setopt(data,CURLOPT_TIMEOUT,local_5c8), CVar8 != CURLE_OK)) {
              local_5c0 = (undefined1  [8])local_5b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5c0,"DOWNLOAD cannot set timeout: ","");
              curl_easy_strerror(CVar8);
              std::__cxx11::string::append(local_5c0);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
              goto LAB_002f3175;
            }
            if (0 < lVar9) {
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,lVar9);
            }
            anon_unknown.dwarf_4f4c3f::cURLProgressHelper::cURLProgressHelper
                      ((cURLProgressHelper *)local_448,this,"download");
            if ((uVar16 & 1) == 0) {
LAB_002f3424:
              if ((local_d0 != 0) &&
                 (CVar8 = curl_easy_setopt(data,CURLOPT_USERPWD,local_d8), CVar8 != CURLE_OK)) {
                local_5c0 = (undefined1  [8])local_5b0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_5c0,"DOWNLOAD cannot set user password: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_5c0);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
                goto LAB_002f3490;
              }
              if (local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                list = (curl_slist *)0x0;
              }
              else {
                list = (curl_slist *)0x0;
                pbVar17 = local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  list = curl_slist_append(list,(pbVar17->_M_dataplus)._M_p);
                  pbVar17 = pbVar17 + 1;
                } while (pbVar17 !=
                         local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
              CVar8 = curl_easy_perform(data);
              curl_slist_free_all(list);
              curl_easy_cleanup(data);
              if (local_398._M_string_length != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
                poVar11 = (ostream *)std::ostream::operator<<(local_5c0,CVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
                pcVar12 = curl_easy_strerror(CVar8);
                poVar11 = std::operator<<(poVar11,pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                pcVar3 = (this->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::AddDefinition(pcVar3,&local_398,local_418._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p,
                                  local_418.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
                std::ios_base::~ios_base(local_550);
              }
              curl_global_cleanup();
              std::ostream::flush();
              std::ofstream::close();
              if (local_5d0.x_ != (cmCryptoHash *)0x0) {
                cmCryptoHash::HashFile(&local_418,local_5d0.x_,&local_3d8);
                if ((cmFileCommand *)local_418._M_string_length == (cmFileCommand *)0x0) {
                  local_5c0 = (undefined1  [8])local_5b0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5c0,"DOWNLOAD cannot compute hash on downloaded file",
                             "");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
                  if (local_5c0 != (undefined1  [8])local_5b0) {
                    operator_delete((void *)local_5c0,
                                    CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                             local_5b0[0]._M_local_buf[0]) + 1);
                  }
LAB_002f39d2:
                  bVar6 = false;
                }
                else {
                  if ((local_3f8._M_string_length != local_418._M_string_length) ||
                     (iVar7 = bcmp(local_3f8._M_dataplus._M_p,local_418._M_dataplus._M_p,
                                   local_418._M_string_length), iVar7 != 0)) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_5c0,"DOWNLOAD HASH mismatch",0x16);
                    poVar11 = std::endl<char,std::char_traits<char>>((ostream *)local_5c0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  for file: [",0xd);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,local_3d8._M_dataplus._M_p,
                                         local_3d8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,"    expected hash: [",0x14);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,local_3f8._M_dataplus._M_p,
                                         local_3f8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,"      actual hash: [",0x14);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,local_418._M_dataplus._M_p,
                                         local_418._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,"           status: [",0x14);
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,CVar8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
                    pcVar12 = curl_easy_strerror(CVar8);
                    poVar11 = std::operator<<(poVar11,pcVar12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"]",2);
                    std::endl<char,std::char_traits<char>>(poVar11);
                    if (CVar8 == CURLE_OK && local_398._M_string_length != 0) {
                      std::operator+(&local_50,"1;HASH mismatch: expected: ",&local_3f8);
                      plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
                      psVar15 = (size_type *)(plVar13 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar13 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar15) {
                        local_90.field_2._M_allocated_capacity = *psVar15;
                        local_90.field_2._8_8_ = plVar13[3];
                        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                      }
                      else {
                        local_90.field_2._M_allocated_capacity = *psVar15;
                        local_90._M_dataplus._M_p = (pointer)*plVar13;
                      }
                      local_90._M_string_length = plVar13[1];
                      *plVar13 = (long)psVar15;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      std::operator+(&local_358,&local_90,&local_418);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_90._M_dataplus._M_p != &local_90.field_2) {
                        operator_delete(local_90._M_dataplus._M_p,
                                        local_90.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                      cmMakefile::AddDefinition
                                ((this->super_cmCommand).Makefile,&local_398,
                                 local_358._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p != &local_358.field_2) {
                        operator_delete(local_358._M_dataplus._M_p,
                                        local_358.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_358);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_358._M_dataplus._M_p != &local_358.field_2) {
                      operator_delete(local_358._M_dataplus._M_p,
                                      local_358.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
                    std::ios_base::~ios_base(local_550);
                    goto LAB_002f39d2;
                  }
                  bVar6 = true;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p,
                                  local_418.field_2._M_allocated_capacity + 1);
                }
                if (bVar6) goto LAB_002f39f9;
                data = (CURL_conflict *)0x0;
                goto LAB_002f34a7;
              }
LAB_002f39f9:
              bVar6 = true;
              if (local_118._M_string_length != 0) {
                local_5c0 = (undefined1  [8])((ulong)local_5c0 & 0xffffffffffffff00);
                std::vector<char,_std::allocator<char>_>::push_back(&local_378,local_5c0);
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,&local_118,
                           local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
              }
              data = (CURL_conflict *)0x0;
            }
            else {
              CVar8 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
              if (CVar8 == CURLE_OK) {
                CVar8 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                         anon_unknown.dwarf_4f4c3f::cmFileDownloadProgressCallback);
                if (CVar8 == CURLE_OK) {
                  CVar8 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,local_448);
                  if (CVar8 == CURLE_OK) goto LAB_002f3424;
                  local_5c0 = (undefined1  [8])local_5b0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5c0,"DOWNLOAD cannot set progress data: ","");
                  curl_easy_strerror(CVar8);
                  std::__cxx11::string::append(local_5c0);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
                }
                else {
                  local_5c0 = (undefined1  [8])local_5b0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5c0,"DOWNLOAD cannot set progress function: ","");
                  curl_easy_strerror(CVar8);
                  std::__cxx11::string::append(local_5c0);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
                }
              }
              else {
                local_5c0 = (undefined1  [8])local_5b0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_5c0,"DOWNLOAD cannot set noprogress value: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_5c0);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
              }
LAB_002f3490:
              if (local_5c0 != (undefined1  [8])local_5b0) {
                operator_delete((void *)local_5c0,
                                CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                         local_5b0[0]._M_local_buf[0]) + 1);
              }
LAB_002f34a7:
              bVar6 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_448._16_8_ != &local_428) {
              operator_delete((void *)local_448._16_8_,local_428._M_allocated_capacity + 1);
            }
          }
          else {
            local_5c0 = (undefined1  [8])local_5b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5c0,"DOWNLOAD cannot set write data: ","");
            curl_easy_strerror(CVar8);
            std::__cxx11::string::append(local_5c0);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
LAB_002f3175:
            if (local_5c0 != (undefined1  [8])local_5b0) {
              operator_delete((void *)local_5c0,
                              CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                       local_5b0[0]._M_local_buf[0]) + 1);
            }
            bVar6 = false;
          }
          if (local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,&local_70);
          bVar6 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_5c0 = (undefined1  [8])local_5b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5c0,"DOWNLOAD cannot set url: ","");
        curl_easy_strerror(CVar8);
        std::__cxx11::string::append(local_5c0);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
LAB_002f2cdf:
        if (local_5c0 != (undefined1  [8])local_5b0) {
          operator_delete((void *)local_5c0,
                          CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                   local_5b0[0]._M_local_buf[0]) + 1);
        }
        bVar6 = false;
      }
      anon_unknown.dwarf_4f4c3f::cURLEasyGuard::~cURLEasyGuard((cURLEasyGuard *)data);
    }
    else {
      local_5c0 = (undefined1  [8])local_5b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5c0,"DOWNLOAD cannot open file for write.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
LAB_002f278e:
      if (local_5c0 != (undefined1  [8])local_5b0) {
        operator_delete((void *)local_5c0,
                        CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,
                                 local_5b0[0]._M_local_buf[0]) + 1);
      }
      bVar6 = false;
    }
    local_318 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_318 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)&local_310);
    std::ios_base::~ios_base(local_220);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                   "DOWNLOAD error: cannot create directory \'",&local_3b8);
    plVar13 = (long *)std::__cxx11::string::append(local_5c0);
    local_318 = (undefined1  [8])&local_308;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar14) {
      local_308._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_308._8_8_ = plVar13[3];
    }
    else {
      local_308._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_318 = (undefined1  [8])*plVar13;
    }
    local_310 = plVar13[1];
    *plVar13 = (long)paVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_5c0 != (undefined1  [8])local_5b0) {
      operator_delete((void *)local_5c0,
                      CONCAT71(local_5b0[0]._M_allocated_capacity._1_7_,local_5b0[0]._M_local_buf[0]
                              ) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
    if (local_318 != (undefined1  [8])&local_308) {
      operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
    }
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
LAB_002f2dfb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_5d0);
  if (local_338 != &local_328) {
    operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                             local_3f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  return bVar6;
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  CM_AUTO_PTR<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(i->c_str());
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash =
        CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(cmCryptoHash::AlgoMD5));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = CM_AUTO_PTR<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash.get()) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file.c_str()) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir.c_str()) &&
      !cmSystemTools::MakeDirectory(dir.c_str())) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#if defined(_WIN32)
  url = fix_file_url_windows(url);
#endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void*)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void*)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = CM_NULLPTR;
  for (std::vector<std::string>::const_iterator h = curl_headers.begin();
       h != curl_headers.end(); ++h) {
    headers = ::curl_slist_append(headers, h->c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get()) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}